

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm3.c
# Opt level: O2

void sm3_process(sm3_context *ctx,uint8_t *data)

{
  uint *puVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint32_t T [64];
  uint32_t W1 [64];
  uint local_348 [68];
  uint auStack_238 [16];
  uint auStack_1f8 [48];
  uint auStack_138 [64];
  int aiStack_38 [2];
  
  for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 1) {
    auStack_238[lVar13] = 0x79cc4519;
  }
  for (lVar13 = 0x10; lVar13 != 0x40; lVar13 = lVar13 + 1) {
    auStack_238[lVar13] = 0x7a879d8a;
  }
  uVar18 = *(uint *)data;
  local_348[0] = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18
  ;
  uVar18 = *(uint *)(data + 4);
  local_348[1] = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18
  ;
  uVar18 = *(uint *)(data + 8);
  local_348[2] = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18
  ;
  uVar18 = *(uint *)(data + 0xc);
  local_348[3] = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18
  ;
  uVar18 = *(uint *)(data + 0x10);
  local_348[4] = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18
  ;
  uVar18 = *(uint *)(data + 0x14);
  local_348[5] = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18
  ;
  uVar18 = *(uint *)(data + 0x18);
  local_348[6] = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18
  ;
  uVar18 = *(uint *)(data + 0x1c);
  local_348[7] = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18
  ;
  uVar18 = *(uint *)(data + 0x20);
  local_348[8] = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18
  ;
  uVar18 = *(uint *)(data + 0x24);
  local_348[9] = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18
  ;
  uVar18 = *(uint *)(data + 0x28);
  local_348[10] =
       uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
  uVar18 = *(uint *)(data + 0x2c);
  local_348[0xb] =
       uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
  uVar18 = *(uint *)(data + 0x30);
  local_348[0xc] =
       uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
  uVar18 = *(uint *)(data + 0x34);
  local_348[0xd] =
       uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
  uVar18 = *(uint *)(data + 0x38);
  local_348[0xe] =
       uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
  uVar18 = *(uint *)(data + 0x3c);
  local_348[0xf] =
       uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
  for (lVar13 = 0; lVar13 != 0x34; lVar13 = lVar13 + 1) {
    uVar18 = (local_348[lVar13 + 0xd] << 0xf | local_348[lVar13 + 0xd] >> 0x11) ^
             local_348[lVar13 + 7] ^ local_348[lVar13];
    local_348[lVar13 + 0x10] =
         (local_348[lVar13 + 3] << 7 | local_348[lVar13 + 3] >> 0x19) ^ local_348[lVar13 + 10] ^
         (uVar18 << 0x17 | uVar18 >> 9) ^ (uVar18 << 0xf | uVar18 >> 0x11) ^ uVar18;
  }
  for (lVar13 = 0; lVar13 != 0x40; lVar13 = lVar13 + 1) {
    auStack_138[lVar13] = local_348[lVar13 + 4] ^ local_348[lVar13];
  }
  uVar18 = ctx->state[1];
  uVar3 = ctx->state[3];
  uVar4 = ctx->state[4];
  uVar5 = ctx->state[5];
  uVar6 = ctx->state[6];
  uVar7 = ctx->state[7];
  uVar17 = ctx->state[0];
  uVar23 = uVar18;
  uVar14 = ctx->state[2];
  uVar15 = uVar3;
  uVar21 = uVar4;
  uVar19 = uVar5;
  uVar16 = uVar6;
  uVar20 = uVar7;
  for (lVar13 = 0; uVar24 = uVar16, uVar16 = uVar21, uVar21 = uVar14, uVar14 = uVar17,
      lVar13 != 0x10; lVar13 = lVar13 + 1) {
    uVar22 = uVar14 << 0xc | uVar14 >> 0x14;
    bVar8 = (byte)lVar13 & 0x1f;
    uVar17 = (auStack_238[lVar13] << bVar8 | auStack_238[lVar13] >> 0x20 - bVar8) + uVar22 + uVar16;
    uVar17 = uVar17 * 0x80 | uVar17 >> 0x19;
    puVar1 = auStack_138 + lVar13;
    uVar9 = uVar23 << 9;
    uVar11 = uVar23 >> 0x17;
    uVar10 = uVar19 << 0x13;
    uVar12 = uVar19 >> 0xd;
    uVar19 = (uVar19 ^ uVar16 ^ uVar24) + uVar20 + local_348[lVar13] + uVar17;
    uVar17 = (uVar21 ^ uVar23 ^ uVar14) + uVar15 + *puVar1 + (uVar22 ^ uVar17);
    uVar23 = uVar14;
    uVar14 = uVar9 | uVar11;
    uVar15 = uVar21;
    uVar21 = (uVar19 * 0x20000 | uVar19 >> 0xf) ^ (uVar19 * 0x200 | uVar19 >> 0x17) ^ uVar19;
    uVar19 = uVar16;
    uVar16 = uVar10 | uVar12;
    uVar20 = uVar24;
  }
  for (lVar13 = -0x30; uVar17 = uVar14, lVar13 != 0; lVar13 = lVar13 + 1) {
    uVar25 = uVar17 << 0xc | uVar17 >> 0x14;
    bVar8 = (char)lVar13 + 0x40U & 0x1f;
    uVar14 = (auStack_138[lVar13] << bVar8 | auStack_138[lVar13] >> 0x20 - bVar8) + uVar25 + uVar16;
    uVar14 = uVar14 * 0x80 | uVar14 >> 0x19;
    piVar2 = aiStack_38 + lVar13;
    uVar9 = uVar23 << 9;
    uVar11 = uVar23 >> 0x17;
    uVar10 = uVar19 << 0x13;
    uVar12 = uVar19 >> 0xd;
    uVar22 = ((uVar19 ^ uVar24) & uVar16 ^ uVar24) + uVar20 + auStack_238[lVar13 + -4] + uVar14;
    uVar14 = (uVar21 & uVar23 | (uVar21 | uVar23) & uVar17) + uVar15 + *piVar2 + (uVar25 ^ uVar14);
    uVar23 = uVar17;
    uVar15 = uVar21;
    uVar19 = uVar16;
    uVar20 = uVar24;
    uVar16 = (uVar22 * 0x20000 | uVar22 >> 0xf) ^ (uVar22 * 0x200 | uVar22 >> 0x17) ^ uVar22;
    uVar21 = uVar9 | uVar11;
    uVar24 = uVar10 | uVar12;
  }
  ctx->state[0] = uVar17 ^ ctx->state[0];
  ctx->state[1] = uVar23 ^ uVar18;
  ctx->state[2] = uVar21 ^ ctx->state[2];
  ctx->state[3] = uVar15 ^ uVar3;
  ctx->state[4] = uVar16 ^ uVar4;
  ctx->state[5] = uVar19 ^ uVar5;
  ctx->state[6] = uVar24 ^ uVar6;
  ctx->state[7] = uVar20 ^ uVar7;
  return;
}

Assistant:

static void sm3_process(struct sm3_context *ctx, const uint8_t data[64])
{
	uint32_t SS1, SS2, TT1, TT2, W[68], W1[64];
	uint32_t A, B, C, D, E, F, G, H;
	uint32_t T[64];
	uint32_t Temp1, Temp2, Temp3, Temp4, Temp5;
	int j;

	for (j = 0; j < 16; j++)
		T[j] = 0x79CC4519;
	for (j = 16; j < 64; j++)
		T[j] = 0x7A879D8A;

	GET_UINT32_BE(W[0], data,  0);
	GET_UINT32_BE(W[1], data,  4);
	GET_UINT32_BE(W[2], data,  8);
	GET_UINT32_BE(W[3], data, 12);
	GET_UINT32_BE(W[4], data, 16);
	GET_UINT32_BE(W[5], data, 20);
	GET_UINT32_BE(W[6], data, 24);
	GET_UINT32_BE(W[7], data, 28);
	GET_UINT32_BE(W[8], data, 32);
	GET_UINT32_BE(W[9], data, 36);
	GET_UINT32_BE(W[10], data, 40);
	GET_UINT32_BE(W[11], data, 44);
	GET_UINT32_BE(W[12], data, 48);
	GET_UINT32_BE(W[13], data, 52);
	GET_UINT32_BE(W[14], data, 56);
	GET_UINT32_BE(W[15], data, 60);

#define FF0(x, y, z)	((x) ^ (y) ^ (z))
#define FF1(x, y, z)	(((x) & (y)) | ((x) & (z)) | ((y) & (z)))

#define GG0(x, y, z)	((x) ^ (y) ^ (z))
#define GG1(x, y, z)	(((x) & (y)) | ((~(x)) & (z)))

#define SHL(x, n)	((x) << (n))
#define ROTL(x, y) ( (((uint32_t)(x)<<(uint32_t)((y)&31)) | (((uint32_t)(x)&0xFFFFFFFFUL)>>(uint32_t)((32-((y)&31))&31))) & 0xFFFFFFFFUL)

#define P0(x)	((x) ^ ROTL((x), 9) ^ ROTL((x), 17))
#define P1(x)	((x) ^ ROTL((x), 15) ^ ROTL((x), 23))

	for (j = 16; j < 68; j++) {
		/*
		 * W[j] = P1( W[j-16] ^ W[j-9] ^ ROTL(W[j-3],15)) ^
		 *        ROTL(W[j - 13],7 ) ^ W[j-6];
		 */

		Temp1 = W[j - 16] ^ W[j - 9];
		Temp2 = ROTL(W[j - 3], 15);
		Temp3 = Temp1 ^ Temp2;
		Temp4 = P1(Temp3);
		Temp5 =  ROTL(W[j - 13], 7) ^ W[j - 6];
		W[j] = Temp4 ^ Temp5;
	}

	for (j =  0; j < 64; j++)
		W1[j] = W[j] ^ W[j + 4];

	A = ctx->state[0];
	B = ctx->state[1];
	C = ctx->state[2];
	D = ctx->state[3];
	E = ctx->state[4];
	F = ctx->state[5];
	G = ctx->state[6];
	H = ctx->state[7];

	for (j = 0; j < 16; j++) {
		SS1 = ROTL(ROTL(A, 12) + E + ROTL(T[j], j), 7);
		SS2 = SS1 ^ ROTL(A, 12);
		TT1 = FF0(A, B, C) + D + SS2 + W1[j];
		TT2 = GG0(E, F, G) + H + SS1 + W[j];
		D = C;
		C = ROTL(B, 9);
		B = A;
		A = TT1;
		H = G;
		G = ROTL(F, 19);
		F = E;
		E = P0(TT2);
	}

	for (j = 16; j < 64; j++) {
		SS1 = ROTL(ROTL(A, 12) + E + ROTL(T[j], j), 7);
		SS2 = SS1 ^ ROTL(A, 12);
		TT1 = FF1(A, B, C) + D + SS2 + W1[j];
		TT2 = GG1(E, F, G) + H + SS1 + W[j];
		D = C;
		C = ROTL(B, 9);
		B = A;
		A = TT1;
		H = G;
		G = ROTL(F, 19);
		F = E;
		E = P0(TT2);
	}

	ctx->state[0] ^= A;
	ctx->state[1] ^= B;
	ctx->state[2] ^= C;
	ctx->state[3] ^= D;
	ctx->state[4] ^= E;
	ctx->state[5] ^= F;
	ctx->state[6] ^= G;
	ctx->state[7] ^= H;
}